

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilters.cpp
# Opt level: O2

void __thiscall
chrono::utils::ChISO2631_Shock_SeatCushionLogger::ChISO2631_Shock_SeatCushionLogger
          (ChISO2631_Shock_SeatCushionLogger *this)

{
  list<chrono::ChRecPoint,_std::allocator<chrono::ChRecPoint>_> *plVar1;
  list<chrono::ChRecPoint,_std::allocator<chrono::ChRecPoint>_> *plVar2;
  
  this->m_tstart1 = 0.2;
  this->m_tstart2 = 0.5;
  this->m_step = 0.00625;
  this->m_mx = 0.015;
  this->m_my = 0.035;
  this->m_mz = 0.032;
  ChButterworth_Lowpass::ChButterworth_Lowpass(&this->m_lpx);
  ChButterworth_Lowpass::ChButterworth_Lowpass(&this->m_lpy);
  ChButterworth_Lowpass::ChButterworth_Lowpass(&this->m_lpz);
  ChButterworth_Lowpass::ChButterworth_Lowpass(&this->m_legacy_lpz);
  plVar1 = &(this->m_raw_inp_x).m_points;
  plVar2 = &(this->m_raw_inp_y).m_points;
  (this->m_raw_inp_x).super_ChFunction._vptr_ChFunction =
       (_func_int **)&PTR__ChFunction_Recorder_01191980;
  (this->m_raw_inp_x).m_points.
  super__List_base<chrono::ChRecPoint,_std::allocator<chrono::ChRecPoint>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)plVar1;
  (this->m_raw_inp_x).m_points.
  super__List_base<chrono::ChRecPoint,_std::allocator<chrono::ChRecPoint>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)plVar1;
  (this->m_raw_inp_x).m_points.
  super__List_base<chrono::ChRecPoint,_std::allocator<chrono::ChRecPoint>_>._M_impl._M_node._M_size
       = 0;
  (this->m_raw_inp_x).m_last._M_node = (_List_node_base *)plVar1;
  (this->m_raw_inp_y).super_ChFunction._vptr_ChFunction =
       (_func_int **)&PTR__ChFunction_Recorder_01191980;
  (this->m_raw_inp_y).m_points.
  super__List_base<chrono::ChRecPoint,_std::allocator<chrono::ChRecPoint>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)plVar2;
  (this->m_raw_inp_y).m_points.
  super__List_base<chrono::ChRecPoint,_std::allocator<chrono::ChRecPoint>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)plVar2;
  (this->m_raw_inp_y).m_points.
  super__List_base<chrono::ChRecPoint,_std::allocator<chrono::ChRecPoint>_>._M_impl._M_node._M_size
       = 0;
  (this->m_raw_inp_y).m_last._M_node = (_List_node_base *)plVar2;
  (this->m_raw_inp_z).super_ChFunction._vptr_ChFunction =
       (_func_int **)&PTR__ChFunction_Recorder_01191980;
  plVar1 = &(this->m_raw_inp_z).m_points;
  (this->m_raw_inp_z).m_points.
  super__List_base<chrono::ChRecPoint,_std::allocator<chrono::ChRecPoint>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)plVar1;
  (this->m_raw_inp_z).m_points.
  super__List_base<chrono::ChRecPoint,_std::allocator<chrono::ChRecPoint>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)plVar1;
  (this->m_raw_inp_z).m_points.
  super__List_base<chrono::ChRecPoint,_std::allocator<chrono::ChRecPoint>_>._M_impl._M_node._M_size
       = 0;
  (this->m_raw_inp_z).m_last._M_node = (_List_node_base *)plVar1;
  (this->m_inp_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_inp_x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_inp_x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_inp_x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_inp_y).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_inp_y).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_inp_y).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_inp_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_inp_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ChISO2631_5_Wxy::ChISO2631_5_Wxy(&this->m_weighting_x);
  ChISO2631_5_Wxy::ChISO2631_5_Wxy(&this->m_weighting_y);
  ChISO2631_5_Wz::ChISO2631_5_Wz((ChISO2631_5_Wz *)&this->field_0x678);
  (this->m_out_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_out_x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_out_x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_out_x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_out_y).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_out_y).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_out_y).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_out_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_out_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

ChISO2631_Shock_SeatCushionLogger::ChISO2631_Shock_SeatCushionLogger() {}